

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O2

int rtosc_arg_vals_eq_single(rtosc_arg_val_t *_lhs,rtosc_arg_val_t *_rhs,rtosc_cmp_options *opt)

{
  double dVar1;
  char *__s1;
  double dVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  char *__s2;
  rtosc_cmp_options *opt_00;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  cVar3 = _lhs->type;
  uVar9 = 0;
  if (cVar3 != _rhs->type) {
    return 0;
  }
  switch(cVar3) {
  case 'a':
    cVar3 = rtosc_av_arr_type(_lhs);
    cVar4 = rtosc_av_arr_type(_rhs);
    if (((cVar3 == cVar4) ||
        ((cVar3 = rtosc_av_arr_type(_lhs), cVar3 == 'T' &&
         (cVar3 = rtosc_av_arr_type(_rhs), cVar3 == 'F')))) ||
       ((cVar3 = rtosc_av_arr_type(_lhs), cVar3 == 'F' &&
        (cVar3 = rtosc_av_arr_type(_rhs), cVar3 == 'T')))) {
      iVar6 = rtosc_av_arr_len(_lhs);
      iVar7 = rtosc_av_arr_len(_rhs);
      iVar5 = rtosc_arg_vals_eq(_lhs + 1,_rhs + 1,(long)iVar6,(long)iVar7,opt_00);
      return iVar5;
    }
    break;
  case 'b':
    if ((_lhs->val).i != (_rhs->val).i) {
      return 0;
    }
    iVar5 = bcmp((_lhs->val).b.data,(_rhs->val).b.data,(long)(_lhs->val).i);
    bVar8 = iVar5 == 0;
    goto LAB_0010eb57;
  case 'c':
  case 'i':
  case 'm':
  case 'r':
    bVar8 = (_lhs->val).i == (_rhs->val).i;
    goto LAB_0010eb57;
  case 'd':
    dVar1 = opt_00->float_tolerance;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar2 = (_lhs->val).d - (_rhs->val).d;
      uVar10 = -(ulong)(dVar2 < -dVar2);
      bVar8 = (double)(~uVar10 & (ulong)dVar2 | (ulong)-dVar2 & uVar10) <= dVar1;
    }
    else {
      bVar8 = (bool)(-((_lhs->val).d == (_rhs->val).d) & 1);
    }
    uVar9 = (uint)bVar8;
    break;
  case 'e':
  case 'g':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
switchD_0010eb0b_caseD_65:
    exit(1);
  case 'f':
    dVar1 = opt_00->float_tolerance;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      fVar11 = (_lhs->val).f - (_rhs->val).f;
      uVar9 = -(uint)(fVar11 < -fVar11);
      bVar8 = (float)(~uVar9 & (uint)fVar11 | (uint)-fVar11 & uVar9) <= (float)dVar1;
    }
    else {
      bVar8 = (bool)(-((_lhs->val).f == (_rhs->val).f) & 1);
    }
    uVar9 = (uint)bVar8;
    break;
  case 'h':
  case 't':
    bVar8 = (_lhs->val).h == (_rhs->val).h;
LAB_0010eb57:
    uVar9 = (uint)bVar8;
    break;
  case 's':
    goto switchD_0010eb0b_caseD_73;
  default:
    if (cVar3 == 'F') {
      return 1;
    }
    if (cVar3 == 'I') {
      return 1;
    }
    if (cVar3 == 'N') {
      return 1;
    }
    if (cVar3 != 'S') {
      if (cVar3 == 'T') {
        return 1;
      }
      goto switchD_0010eb0b_caseD_65;
    }
switchD_0010eb0b_caseD_73:
    __s1 = (_lhs->val).s;
    __s2 = (_rhs->val).s;
    if (__s1 == (char *)0x0) {
LAB_0010ecac:
      bVar8 = __s1 == __s2;
    }
    else {
      if (__s2 == (char *)0x0) {
        __s2 = (char *)0x0;
        goto LAB_0010ecac;
      }
      iVar5 = strcmp(__s1,__s2);
      bVar8 = iVar5 == 0;
    }
    uVar9 = (uint)bVar8;
  }
  return uVar9;
}

Assistant:

int rtosc_arg_vals_eq_single(const rtosc_arg_val_t* _lhs,
                             const rtosc_arg_val_t* _rhs,
                             const rtosc_cmp_options* opt)
{
#define mfabs(val) (((val) >= 0) ? (val) : -(val))
    int rval;

    if(!opt)
        opt = &default_cmp_options;

    if(_lhs->type == _rhs->type)
    switch(_lhs->type)
    {
        case 'i':
        case 'c':
        case 'r':
            rval = _lhs->val.i == _rhs->val.i;
            break;
        case 'I':
        case 'T':
        case 'F':
        case 'N':
            rval = 1;
            break;
        case 'f':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.f == _rhs->val.f
                   : mfabs(_lhs->val.f - _rhs->val.f) <=
                   (float)opt->float_tolerance;
            break;
        case 'd':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.d == _rhs->val.d
                   : mfabs(_lhs->val.d - _rhs->val.d) <=
                   opt->float_tolerance;
            break;
        case 'h':
            rval = _lhs->val.h == _rhs->val.h;
            break;
        case 't':
            rval = _lhs->val.t == _rhs->val.t;
            break;
        case 'm':
            rval = 0 == memcmp(_lhs->val.m, _rhs->val.m, 4);
            break;
        case 's':
        case 'S':
            rval = (_lhs->val.s == NULL || _rhs->val.s == NULL)
                 ? _lhs->val.s == _rhs->val.s
                 : (0 == strcmp(_lhs->val.s, _rhs->val.s));
            break;
        case 'b':
        {
            int32_t lbs = _lhs->val.b.len,
                    rbs = _rhs->val.b.len;
            rval = lbs == rbs;
            if(rval)
                rval = 0 == memcmp(_lhs->val.b.data, _rhs->val.b.data, lbs);
            break;
        }
        case 'a':
        {
            if(     rtosc_av_arr_type(_lhs) != rtosc_av_arr_type(_rhs)
               && !(rtosc_av_arr_type(_lhs) == 'T' && rtosc_av_arr_type(_rhs) == 'F')
               && !(rtosc_av_arr_type(_lhs) == 'F' && rtosc_av_arr_type(_rhs) == 'T'))
                rval = 0;
            else
                rval = rtosc_arg_vals_eq(_lhs+1, _rhs+1,
                                         rtosc_av_arr_len(_lhs), rtosc_av_arr_len(_rhs),
                                         opt);
            break;
        }
        default:
            rval = -1;
            // no recovery: the programmer did not pass the right args, and
            // we don't have a function to compare ranges here
            assert(false);
            exit(1);
            break;
    }
    else
    {
        rval = 0;
    }
    return rval;
#undef mfabs
}